

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putcolj.c
# Opt level: O3

int ffpcnj(fitsfile *fptr,int colnum,LONGLONG firstrow,LONGLONG firstelem,LONGLONG nelem,long *array
          ,long nulvalue,int *status)

{
  tcolumn *ptVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long *array_00;
  ulong uVar8;
  ulong uVar9;
  ulong nelempar;
  ulong nelem_00;
  long lVar10;
  long local_90;
  
  if (0 < *status) {
    return *status;
  }
  if (fptr->HDUposition == fptr->Fptr->curhdu) {
    if ((fptr->Fptr->datastart == -1) && (iVar3 = ffrdef(fptr,status), 0 < iVar3))
    goto LAB_001a9825;
  }
  else {
    ffmahd(fptr,fptr->HDUposition + 1,(int *)0x0,status);
  }
  ptVar1 = fptr->Fptr->tableptr;
  iVar3 = ptVar1[(long)colnum + -1].tdatatype;
  if (iVar3 < 1) {
    local_90 = firstelem + -1 + nelem;
    if ((iVar3 < 0) &&
       (iVar4 = ffpclj(fptr,colnum,firstrow,firstelem,nelem,array,status), 0 < iVar4)) {
      if (*status != 0x19c) {
        return *status;
      }
      *status = 0;
    }
  }
  else {
    local_90 = ptVar1[(long)colnum + -1].trepeat;
  }
  if (0 < nelem) {
    lVar10 = (firstrow + -1) * local_90;
    lVar7 = lVar10 + firstelem;
    bVar2 = false;
    nelempar = 0;
    uVar8 = 0;
    do {
      nelem_00 = 0;
      array_00 = array + nelem;
      while (array[uVar8 + nelem_00] != nulvalue) {
        if ((nelempar != 0) &&
           (lVar6 = lVar7 + uVar8 + nelem_00, lVar5 = (long)(~nelempar + lVar6) / local_90,
           iVar4 = ffpclu(fptr,colnum,lVar5 + 1,lVar6 + (-local_90 * lVar5 - nelempar),nelempar,
                          status), 0 < iVar4)) {
          return *status;
        }
        nelem_00 = nelem_00 + 1;
        array_00 = array_00 + -1;
        nelempar = 0;
        if (nelem - uVar8 == nelem_00) {
          if (0 < iVar3) {
            lVar10 = nelem + firstelem + lVar10;
            lVar7 = (long)(~nelem_00 + lVar10) / local_90;
            ffpclj(fptr,colnum,lVar7 + 1,(lVar10 - local_90 * lVar7) - nelem_00,nelem_00,array_00,
                   status);
          }
          goto LAB_001a98d5;
        }
      }
      if ((nelem_00 != 0 && 0 < iVar3) &&
         (lVar6 = (long)(uVar8 + lVar7 + -1) / local_90,
         iVar4 = ffpclj(fptr,colnum,lVar6 + 1,(uVar8 + lVar7) - lVar6 * local_90,nelem_00,
                        array + uVar8,status), 0 < iVar4)) {
        if (*status != 0x19c) {
          return *status;
        }
        *status = 0;
        bVar2 = true;
      }
      nelempar = nelempar + 1;
      uVar9 = ~uVar8;
      uVar8 = uVar8 + nelem_00 + 1;
      if (uVar9 + nelem == nelem_00) {
        if (nelempar != 0) {
          lVar10 = (long)(lVar7 + (nelem - nelempar) + -1) / local_90;
          ffpclu(fptr,colnum,lVar10 + 1,(lVar7 + (nelem - nelempar)) - lVar10 * local_90,nelempar,
                 status);
        }
LAB_001a98d5:
        if (0 < *status || !bVar2) {
          return *status;
        }
        *status = 0x19c;
        return 0x19c;
      }
    } while( true );
  }
LAB_001a9825:
  return *status;
}

Assistant:

int ffpcnj( fitsfile *fptr,  /* I - FITS file pointer                       */
            int  colnum,     /* I - number of column to write (1 = 1st col) */
            LONGLONG  firstrow,  /* I - first row to write (1 = 1st row)        */
            LONGLONG  firstelem, /* I - first vector element to write (1 = 1st) */
            LONGLONG  nelem,     /* I - number of values to write               */
            long  *array,    /* I - array of values to write                */
            long   nulvalue, /* I - value used to flag undefined pixels     */
            int  *status)    /* IO - error status                           */
/*
  Write an array of elements to the specified column of a table.  Any input
  pixels equal to the value of nulvalue will be replaced by the appropriate
  null value in the output FITS file. 

  The input array of values will be converted to the datatype of the column 
  and will be inverse-scaled by the FITS TSCALn and TZEROn values if necessary
*/
{
    tcolumn *colptr;
    LONGLONG  ngood = 0, nbad = 0, ii;
    LONGLONG repeat, first, fstelm, fstrow;
    int tcode, overflow = 0;
 
    if (*status > 0)
        return(*status);

    /* reset position to the correct HDU if necessary */
    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
    {
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);
    }
    else if ((fptr->Fptr)->datastart == DATA_UNDEFINED)
    {
        if ( ffrdef(fptr, status) > 0)               /* rescan header */
            return(*status);
    }

    colptr  = (fptr->Fptr)->tableptr;   /* point to first column */
    colptr += (colnum - 1);     /* offset to correct column structure */

    tcode  = colptr->tdatatype;

    if (tcode > 0)
       repeat = colptr->trepeat;  /* repeat count for this column */
    else
       repeat = firstelem -1 + nelem;  /* variable length arrays */

    /* if variable length array, first write the whole input vector, 
       then go back and fill in the nulls */
    if (tcode < 0) {
      if (ffpclj(fptr, colnum, firstrow, firstelem, nelem, array, status) > 0) {
        if (*status == NUM_OVERFLOW) 
	{
	  /* ignore overflows, which are possibly the null pixel values */
	  /*  overflow = 1;   */
	  *status = 0;
	} else { 
          return(*status);
	}
      }
    }

    /* absolute element number in the column */
    first = (firstrow - 1) * repeat + firstelem;

    for (ii = 0; ii < nelem; ii++)
    {
      if (array[ii] != nulvalue)  /* is this a good pixel? */
      {
         if (nbad)  /* write previous string of bad pixels */
         {
            fstelm = ii - nbad + first;  /* absolute element number */
            fstrow = (fstelm - 1) / repeat + 1;  /* starting row number */
            fstelm = fstelm - (fstrow - 1) * repeat;  /* relative number */
	  
            if (ffpclu(fptr, colnum, fstrow, fstelm, nbad, status) > 0)
                return(*status);

            nbad=0;
         }

         ngood = ngood + 1;  /* the consecutive number of good pixels */
      }
      else
      {
         if (ngood)  /* write previous string of good pixels */
         {
            fstelm = ii - ngood + first;  /* absolute element number */
            fstrow = (fstelm - 1) / repeat + 1;  /* starting row number */
            fstelm = fstelm - (fstrow - 1) * repeat;  /* relative number */

            if (tcode > 0) {  /* variable length arrays have already been written */
              if (ffpclj(fptr, colnum, fstrow, fstelm, ngood, &array[ii-ngood],
                status) > 0) {
		if (*status == NUM_OVERFLOW) 
		{
		  overflow = 1;
		  *status = 0;
		} else { 
                  return(*status);
		}
	      }
	    }
            ngood=0;
         }

         nbad = nbad +1;  /* the consecutive number of bad pixels */
      }
    }

    /* finished loop;  now just write the last set of pixels */

    if (ngood)  /* write last string of good pixels */
    {
      fstelm = ii - ngood + first;  /* absolute element number */
      fstrow = (fstelm - 1) / repeat + 1;  /* starting row number */
      fstelm = fstelm - (fstrow - 1) * repeat;  /* relative number */

      if (tcode > 0) {  /* variable length arrays have already been written */
        ffpclj(fptr, colnum, fstrow, fstelm, ngood, &array[ii-ngood], status);
      }
    }
    else if (nbad) /* write last string of bad pixels */
    {
      fstelm = ii - nbad + first;  /* absolute element number */
      fstrow = (fstelm - 1) / repeat + 1;  /* starting row number */
      fstelm = fstelm - (fstrow - 1) * repeat;  /* relative number */

      ffpclu(fptr, colnum, fstrow, fstelm, nbad, status);
    }

    if (*status <= 0) {
      if (overflow) {
        *status = NUM_OVERFLOW;
      }
    }

    return(*status);
}